

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_uescape(void)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  int __fd;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  void *__buf;
  void *pvVar10;
  void *__s2;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  uencode_test_t tests [7];
  bson_t b;
  bson_error_t error;
  void *local_3f8;
  char *local_3f0;
  void *local_3e8;
  char *local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined8 local_388;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [640];
  
  uVar5 = bson_bcon_magic();
  local_3f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_47a2 + 0xc,0);
  uVar6 = bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  uVar7 = bcon_new(0,"quote",uVar5,0,"\"",0);
  uVar8 = bcon_new(0,"backslash",uVar5,0,"\\",0);
  uVar9 = bcon_new(0,"",uVar5,0,"",0);
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  local_388 = bson_new();
  local_3f0 = "{ \"euro\": \"\\u20AC\"}";
  local_3e8 = local_3f8;
  local_3e0 = "{ \"crlf\": \"\\r\\n\"}";
  local_3d0 = "{ \"quote\": \"\\\"\"}";
  local_3c0 = "{ \"backslash\": \"\\\\\"}";
  local_3b0 = "{ \"\": \"\"}";
  local_3a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  local_390 = "{ \"nil\": \"\\u0000\"}";
  local_3d8 = uVar6;
  local_3c8 = uVar7;
  local_3b8 = uVar8;
  local_3a8 = uVar9;
  local_398 = uVar5;
  bson_append_utf8(local_388,"nil",0xffffffffffffffff,"",1);
  lVar13 = 8;
  while( true ) {
    if (lVar13 == 0x78) {
      for (lVar13 = 8; lVar13 != 0x78; lVar13 = lVar13 + 0x10) {
        bson_destroy(*(undefined8 *)((long)&local_3f0 + lVar13));
      }
      return;
    }
    cVar3 = bson_init_from_json(local_380,*(undefined8 *)((long)&local_3f8 + lVar13),
                                0xffffffffffffffff,local_2b8);
    if (cVar3 == '\0') break;
    local_3f8 = (void *)bson_get_data(local_380);
    lVar2 = *(long *)((long)&local_3f0 + lVar13);
    __buf = (void *)bson_get_data(lVar2);
    if (*(uint *)(lVar2 + 4) != local_37c) {
LAB_00125163:
      uVar14 = 0;
      uVar5 = bson_as_canonical_extended_json(local_380,0);
      uVar6 = bson_as_canonical_extended_json(lVar2,0);
      pvVar10 = local_3f8;
      uVar1 = *(uint *)(lVar2 + 4);
      goto LAB_00125195;
    }
    pvVar10 = (void *)bson_get_data(lVar2);
    __s2 = (void *)bson_get_data(local_380);
    iVar4 = bcmp(pvVar10,__s2,(ulong)*(uint *)(lVar2 + 4));
    if (iVar4 != 0) goto LAB_00125163;
    bson_destroy(local_380);
    lVar13 = lVar13 + 0x10;
  }
  fprintf(_stderr,"%s\n",local_2b0);
  pcVar12 = "r";
  uVar5 = 0x773;
  goto LAB_0012529a;
LAB_00125195:
  if ((local_37c == (uint)uVar14) || (uVar1 <= (uint)uVar14)) goto LAB_001251ae;
  if (*(char *)((long)local_3f8 + uVar14) != *(char *)((long)__buf + uVar14)) {
    uVar14 = uVar14 & 0xffffffff;
    goto LAB_001251ba;
  }
  uVar14 = uVar14 + 1;
  goto LAB_00125195;
LAB_001251ae:
  uVar11 = local_37c;
  if (local_37c < uVar1) {
    uVar11 = uVar1;
  }
  uVar14 = (ulong)(uVar11 - 1);
LAB_001251ba:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar14,uVar5,uVar6);
  iVar4 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar4 == -1) {
    pcVar12 = "fd1 != -1";
  }
  else if (__fd == -1) {
    pcVar12 = "fd2 != -1";
  }
  else {
    uVar14 = write(iVar4,pvVar10,(ulong)local_37c);
    if (uVar14 == local_37c) {
      uVar1 = *(uint *)(lVar2 + 4);
      uVar14 = write(__fd,__buf,(ulong)uVar1);
      if (uVar14 == uVar1) {
        close(iVar4);
        close(__fd);
        pcVar12 = "0";
      }
      else {
        pcVar12 = 
        "(tests[i].expected_bson)->len == bson_write (fd2, expected_data, (tests[i].expected_bson)->len)"
        ;
      }
    }
    else {
      pcVar12 = "(&b)->len == bson_write (fd1, bson_data, (&b)->len)";
    }
  }
  uVar5 = 0x774;
LAB_0012529a:
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_json_uescape",pcVar12);
  abort();
}

Assistant:

static void
test_bson_json_uescape (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   const char *euro = "{ \"euro\": \"\\u20AC\"}";
   bson_t *bson_euro = BCON_NEW ("euro", BCON_UTF8 ("\xE2\x82\xAC"));

   const char *crlf = "{ \"crlf\": \"\\r\\n\"}";
   bson_t *bson_crlf = BCON_NEW ("crlf", BCON_UTF8 ("\r\n"));

   const char *quote = "{ \"quote\": \"\\\"\"}";
   bson_t *bson_quote = BCON_NEW ("quote", BCON_UTF8 ("\""));

   const char *backslash = "{ \"backslash\": \"\\\\\"}";
   bson_t *bson_backslash = BCON_NEW ("backslash", BCON_UTF8 ("\\"));

   const char *empty = "{ \"\": \"\"}";
   bson_t *bson_empty = BCON_NEW ("", BCON_UTF8 (""));

   const char *escapes = "{ \"escapes\": \"\\f\\b\\t\"}";
   bson_t *bson_escapes = BCON_NEW ("escapes", BCON_UTF8 ("\f\b\t"));

   const char *nil_byte = "{ \"nil\": \"\\u0000\"}";
   bson_t *bson_nil_byte = bson_new (); /* we'll append "\0" to it, below */

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } uencode_test_t;

   uencode_test_t tests[] = {
      {euro, bson_euro},
      {crlf, bson_crlf},
      {quote, bson_quote},
      {backslash, bson_backslash},
      {empty, bson_empty},
      {escapes, bson_escapes},
      {nil_byte, bson_nil_byte},
   };

   int n_tests = sizeof (tests) / sizeof (uencode_test_t);
   int i;

   bson_append_utf8 (bson_nil_byte, "nil", -1, "\0", 1);

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);

      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}